

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ClearColorImage
          (VulkanCommandBuffer *this,VkImage Image,VkClearColorValue *Color,
          VkImageSubresourceRange *Subresource)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  VkImageSubresourceRange *Subresource_local;
  VkClearColorValue *Color_local;
  VkImage Image_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Subresource;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Subresource);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x35);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = IsInRenderScope(this);
  if (bVar1) {
    Diligent::FormatString<char[166]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [166])
               "vkCmdClearColorImage() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x38);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (*(int *)msg.field_2._8_8_ != 1) {
    Diligent::FormatString<char[202]>
              ((string *)local_98,
               (char (*) [202])
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_COLOR_BIT (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-aspectMask-02498)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x3b);
    std::__cxx11::string::~string((string *)local_98);
  }
  FlushBarriers(this);
  (*vkCmdClearColorImage)
            (this->m_VkCmdBuffer,Image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,Color,1,
             (VkImageSubresourceRange *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void ClearColorImage(VkImage                        Image,
                                       const VkClearColorValue&       Color,
                                       const VkImageSubresourceRange& Subresource)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdClearColorImage() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-renderpass)");
        VERIFY(Subresource.aspectMask == VK_IMAGE_ASPECT_COLOR_BIT,
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_COLOR_BIT "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-aspectMask-02498)");

        FlushBarriers();
        vkCmdClearColorImage(
            m_VkCmdBuffer,
            Image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, // must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
            &Color,
            1,
            &Subresource);
    }